

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  Intersectors *k;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vfloat_impl<4> vVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  vbool<4> vVar51;
  size_t sVar52;
  bool bVar53;
  undefined4 uVar54;
  AABBNodeMB4D *node1;
  int iVar55;
  undefined1 *puVar56;
  Intersectors *pIVar57;
  ulong uVar58;
  ulong uVar59;
  uint uVar60;
  Intersectors *pIVar61;
  ulong uVar62;
  Intersectors *pIVar63;
  ulong uVar64;
  Intersectors *pIVar65;
  undefined8 extraout_RDX;
  undefined8 uVar66;
  undefined8 extraout_RDX_00;
  Intersectors *extraout_RDX_01;
  NodeRef root;
  size_t sVar67;
  long lVar68;
  long lVar69;
  ulong uVar70;
  QuadMesh *mesh_4;
  NodeRef *pNVar71;
  size_t i;
  long lVar72;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar73;
  float fVar74;
  float fVar75;
  float fVar87;
  float fVar89;
  vint4 ai;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar91;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar88;
  float fVar90;
  float fVar92;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar93;
  float fVar104;
  float fVar105;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar106;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar119;
  float fVar121;
  vint4 ai_1;
  undefined1 auVar114 [16];
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  float fVar122;
  float fVar124;
  vfloat_impl<4> vVar117;
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar129;
  float fVar131;
  vint4 ai_3;
  undefined1 auVar127 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar128 [16];
  float fVar135;
  float fVar141;
  float fVar142;
  vint4 bi;
  undefined1 auVar136 [16];
  float fVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  vint4 bi_3;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar165;
  float fVar166;
  vint4 bi_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar167;
  undefined1 auVar162 [16];
  vfloat_impl<4> vVar163;
  undefined1 auVar164 [16];
  uint uVar168;
  uint uVar169;
  float fVar170;
  uint uVar171;
  uint uVar172;
  float fVar173;
  uint uVar174;
  uint uVar175;
  float fVar176;
  vint4 ai_2;
  uint uVar177;
  uint uVar178;
  float fVar179;
  uint uVar180;
  uint uVar181;
  uint uVar182;
  vint4 bi_2;
  uint uVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar187 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  uint uVar207;
  float fVar208;
  float fVar209;
  uint uVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  int iVar216;
  float fVar217;
  int iVar218;
  float fVar219;
  int iVar220;
  float fVar221;
  int iVar222;
  float fVar223;
  float fVar224;
  float fVar228;
  float fVar229;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar225;
  float fVar230;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_19e8 [16];
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  QuadMesh *mesh;
  undefined1 local_19a8 [16];
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1908 [16];
  float local_18f8;
  float fStack_18f4;
  undefined8 uStack_18f0;
  vbool<4> terminated;
  undefined8 uStack_1880;
  vint<4> itime;
  vfloat_impl<4> local_1868;
  vfloat_impl<4> local_1858;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar32 = mm_lookupmask_ps._248_8_;
  uVar31 = mm_lookupmask_ps._240_8_;
  uVar30 = mm_lookupmask_ps._8_8_;
  uVar29 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar227._8_4_ = 0xffffffff;
    auVar227._0_8_ = 0xffffffffffffffff;
    auVar227._12_4_ = 0xffffffff;
    auVar114 = *(undefined1 (*) [16])(ray + 0x80);
    auVar127._0_12_ = ZEXT812(0);
    auVar127._12_4_ = 0;
    auVar94._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar114._0_4_);
    auVar94._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar114._4_4_);
    auVar94._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar114._8_4_);
    auVar94._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar114._12_4_);
    uVar60 = movmskps((int)context,auVar94);
    pIVar61 = (Intersectors *)(ulong)uVar60;
    if (uVar60 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar144 = (float)DAT_01f4bd50;
      fVar148 = DAT_01f4bd50._4_4_;
      fVar153 = DAT_01f4bd50._8_4_;
      fVar156 = DAT_01f4bd50._12_4_;
      auVar77._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar148);
      auVar77._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar144);
      auVar77._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar153);
      auVar77._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar156);
      auVar160 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar77
                         );
      auVar95._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar148);
      auVar95._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar144);
      auVar95._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar153);
      auVar95._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar156);
      auVar95 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar95)
      ;
      auVar76._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar148);
      auVar76._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar144);
      auVar76._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar153);
      auVar76._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar156);
      auVar136 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar76
                         );
      auVar77 = rcpps(auVar76,auVar160);
      fVar144 = auVar77._0_4_;
      auVar161._0_4_ = auVar160._0_4_ * fVar144;
      fVar148 = auVar77._4_4_;
      auVar161._4_4_ = auVar160._4_4_ * fVar148;
      fVar153 = auVar77._8_4_;
      auVar161._8_4_ = auVar160._8_4_ * fVar153;
      fVar156 = auVar77._12_4_;
      auVar161._12_4_ = auVar160._12_4_ * fVar156;
      tray.rdir.field_0._0_4_ = (1.0 - auVar161._0_4_) * fVar144 + fVar144;
      tray.rdir.field_0._4_4_ = (1.0 - auVar161._4_4_) * fVar148 + fVar148;
      tray.rdir.field_0._8_4_ = (1.0 - auVar161._8_4_) * fVar153 + fVar153;
      tray.rdir.field_0._12_4_ = (1.0 - auVar161._12_4_) * fVar156 + fVar156;
      auVar77 = rcpps(auVar161,auVar95);
      fVar144 = auVar77._0_4_;
      fVar148 = auVar77._4_4_;
      fVar153 = auVar77._8_4_;
      fVar156 = auVar77._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar95._0_4_ * fVar144) * fVar144 + fVar144;
      tray.rdir.field_0._20_4_ = (1.0 - auVar95._4_4_ * fVar148) * fVar148 + fVar148;
      tray.rdir.field_0._24_4_ = (1.0 - auVar95._8_4_ * fVar153) * fVar153 + fVar153;
      tray.rdir.field_0._28_4_ = (1.0 - auVar95._12_4_ * fVar156) * fVar156 + fVar156;
      auVar77 = rcpps(auVar77,auVar136);
      fVar144 = auVar77._0_4_;
      fVar148 = auVar77._4_4_;
      fVar153 = auVar77._8_4_;
      fVar156 = auVar77._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar136._0_4_ * fVar144) * fVar144 + fVar144;
      tray.rdir.field_0._36_4_ = (1.0 - auVar136._4_4_ * fVar148) * fVar148 + fVar148;
      tray.rdir.field_0._40_4_ = (1.0 - auVar136._8_4_ * fVar153) * fVar153 + fVar153;
      tray.rdir.field_0._44_4_ = (1.0 - auVar136._12_4_ * fVar156) * fVar156 + fVar156;
      auVar136._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar136._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar136._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar136._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar136);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar160._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar160._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar160._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar160._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar160);
      auVar77 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar127);
      iVar216 = (int)DAT_01f45a30;
      iVar218 = DAT_01f45a30._4_4_;
      iVar220 = DAT_01f45a30._8_4_;
      iVar222 = DAT_01f45a30._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar77,auVar94);
      auVar114 = maxps(auVar114,auVar127);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar114,auVar94);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar227 ^ auVar94);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pIVar63 = (Intersectors *)0x3;
      }
      else {
        pIVar61 = (Intersectors *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        pIVar63 = (Intersectors *)((ulong)((char)pIVar61 == '\0') + 2);
      }
      pNVar71 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar73 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar56 = mm_lookupmask_ps;
      pIVar65 = pIVar63;
LAB_006cdeae:
      do {
        do {
          root.ptr = pNVar71[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006cf5fc;
          pNVar71 = pNVar71 + -1;
          paVar73 = paVar73 + -1;
          aVar225.v = *(__m128 *)paVar73->v;
          auVar114._4_4_ = -(uint)(aVar225.v[1] < tray.tfar.field_0.v[1]);
          auVar114._0_4_ = -(uint)(aVar225.v[0] < tray.tfar.field_0.v[0]);
          auVar114._8_4_ = -(uint)(aVar225.v[2] < tray.tfar.field_0.v[2]);
          auVar114._12_4_ = -(uint)(aVar225._12_4_ < tray.tfar.field_0.v[3]);
          uVar60 = movmskps((int)puVar56,auVar114);
          puVar56 = (undefined1 *)(ulong)uVar60;
        } while (uVar60 == 0);
        uVar58 = (ulong)(byte)uVar60;
        pIVar57 = (Intersectors *)(ulong)(uint)POPCOUNT(uVar60 & 0xff);
        puVar56 = (undefined1 *)pIVar57;
        if (pIVar63 < pIVar57) {
LAB_006cdef4:
          do {
            vVar51.field_0 = terminated.field_0;
            sVar67 = 8;
            pIVar57 = (Intersectors *)&DAT_fffffffffffffff0;
            fVar144 = aVar225.v[0];
            fVar148 = aVar225.v[1];
            fVar153 = aVar225.v[2];
            fVar156 = aVar225.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006cf5fc;
              auVar80._4_4_ = -(uint)(fVar148 < tray.tfar.field_0.v[1]);
              auVar80._0_4_ = -(uint)(fVar144 < tray.tfar.field_0.v[0]);
              auVar80._8_4_ = -(uint)(fVar153 < tray.tfar.field_0.v[2]);
              auVar80._12_4_ = -(uint)(fVar156 < tray.tfar.field_0.v[3]);
              uVar60 = movmskps((int)puVar56,auVar80);
              puVar56 = (undefined1 *)(ulong)uVar60;
              if (uVar60 == 0) goto LAB_006cdeae;
              valid_i = (vint<4> *)((ulong)((uint)root.ptr & 0xf) - 8);
              local_1908._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_1908._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              local_1908._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              pIVar61 = (Intersectors *)0x0;
              goto LAB_006ce1c5;
            }
            uVar58 = root.ptr & 0xfffffffffffffff0;
            uVar60 = (uint)root.ptr & 7;
            aVar225.i[1] = iVar218;
            aVar225.i[0] = iVar216;
            aVar225.i[2] = iVar220;
            aVar225.i[3] = iVar222;
            while( true ) {
              if ((pIVar57 == (Intersectors *)0x0) ||
                 (sVar3 = *(size_t *)(uVar58 + 0x20 + (long)pIVar57 * 2), sVar3 == 8)) break;
              fVar91 = *(float *)((long)&(pIVar57->intersector8).occluded + uVar58);
              fVar112 = *(float *)((long)&(pIVar57->intersector1).pointQuery + uVar58);
              fVar143 = *(float *)((long)&(pIVar57->intersector4).intersect + uVar58);
              fVar123 = *(float *)((long)&(pIVar57->intersector4).name + uVar58);
              fVar145 = *(float *)((long)&(pIVar57->intersector4_filter).occluded + uVar58);
              fVar196 = *(float *)(ray + 0x70);
              fVar198 = *(float *)(ray + 0x74);
              fVar200 = *(float *)(ray + 0x78);
              fVar202 = *(float *)(ray + 0x7c);
              fVar125 = *(float *)((long)&(pIVar57->intersector8_filter).name + uVar58);
              fVar133 = *(float *)((long)&(pIVar57->intersector16).intersect + uVar58);
              fVar135 = *(float *)((long)&(pIVar57->intersector4_nofilter).intersect + uVar58);
              fVar149 = *(float *)((long)&(pIVar57->intersector8_filter).intersect + uVar58);
              fVar154 = *(float *)((long)&(pIVar57->intersector8_nofilter).occluded + uVar58);
              fVar157 = *(float *)((long)&(pIVar57->intersector16).name + uVar58);
              fVar214 = *(float *)((long)&(pIVar57->intersector4_nofilter).name + uVar58);
              fVar188 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar193 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar74 = ((fVar91 * fVar196 + fVar112) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar87 = ((fVar91 * fVar198 + fVar112) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar89 = ((fVar91 * fVar200 + fVar112) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar91 = ((fVar91 * fVar202 + fVar112) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar112 = ((fVar125 * fVar196 + fVar123) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar119 = ((fVar125 * fVar198 + fVar123) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar121 = ((fVar125 * fVar200 + fVar123) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar123 = ((fVar125 * fVar202 + fVar123) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar125 = ((fVar133 * fVar196 + fVar135) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar129 = ((fVar133 * fVar198 + fVar135) - fVar188) * (float)tray.rdir.field_0._36_4_;
              fVar131 = ((fVar133 * fVar200 + fVar135) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar133 = ((fVar133 * fVar202 + fVar135) - fVar193) * (float)tray.rdir.field_0._44_4_;
              fVar135 = ((fVar149 * fVar196 + fVar143) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar141 = ((fVar149 * fVar198 + fVar143) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar142 = ((fVar149 * fVar200 + fVar143) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar143 = ((fVar149 * fVar202 + fVar143) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar159 = ((fVar154 * fVar196 + fVar145) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar165 = ((fVar154 * fVar198 + fVar145) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar166 = ((fVar154 * fVar200 + fVar145) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar167 = ((fVar154 * fVar202 + fVar145) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar145 = ((fVar157 * fVar196 + fVar214) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar149 = ((fVar157 * fVar198 + fVar214) - fVar188) * (float)tray.rdir.field_0._36_4_;
              fVar154 = ((fVar157 * fVar200 + fVar214) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar157 = ((fVar157 * fVar202 + fVar214) - fVar193) * (float)tray.rdir.field_0._44_4_;
              uVar168 = (uint)((int)fVar135 < (int)fVar74) * (int)fVar135 |
                        (uint)((int)fVar135 >= (int)fVar74) * (int)fVar74;
              uVar171 = (uint)((int)fVar141 < (int)fVar87) * (int)fVar141 |
                        (uint)((int)fVar141 >= (int)fVar87) * (int)fVar87;
              uVar174 = (uint)((int)fVar142 < (int)fVar89) * (int)fVar142 |
                        (uint)((int)fVar142 >= (int)fVar89) * (int)fVar89;
              uVar177 = (uint)((int)fVar143 < (int)fVar91) * (int)fVar143 |
                        (uint)((int)fVar143 >= (int)fVar91) * (int)fVar91;
              uVar180 = (uint)((int)fVar159 < (int)fVar112) * (int)fVar159 |
                        (uint)((int)fVar159 >= (int)fVar112) * (int)fVar112;
              uVar181 = (uint)((int)fVar165 < (int)fVar119) * (int)fVar165 |
                        (uint)((int)fVar165 >= (int)fVar119) * (int)fVar119;
              uVar182 = (uint)((int)fVar166 < (int)fVar121) * (int)fVar166 |
                        (uint)((int)fVar166 >= (int)fVar121) * (int)fVar121;
              uVar183 = (uint)((int)fVar167 < (int)fVar123) * (int)fVar167 |
                        (uint)((int)fVar167 >= (int)fVar123) * (int)fVar123;
              uVar180 = ((int)uVar180 < (int)uVar168) * uVar168 |
                        ((int)uVar180 >= (int)uVar168) * uVar180;
              uVar181 = ((int)uVar181 < (int)uVar171) * uVar171 |
                        ((int)uVar181 >= (int)uVar171) * uVar181;
              uVar182 = ((int)uVar182 < (int)uVar174) * uVar174 |
                        ((int)uVar182 >= (int)uVar174) * uVar182;
              uVar183 = ((int)uVar183 < (int)uVar177) * uVar177 |
                        ((int)uVar183 >= (int)uVar177) * uVar183;
              uVar168 = (uint)((int)fVar145 < (int)fVar125) * (int)fVar145 |
                        (uint)((int)fVar145 >= (int)fVar125) * (int)fVar125;
              uVar171 = (uint)((int)fVar149 < (int)fVar129) * (int)fVar149 |
                        (uint)((int)fVar149 >= (int)fVar129) * (int)fVar129;
              uVar174 = (uint)((int)fVar154 < (int)fVar131) * (int)fVar154 |
                        (uint)((int)fVar154 >= (int)fVar131) * (int)fVar131;
              uVar177 = (uint)((int)fVar157 < (int)fVar133) * (int)fVar157 |
                        (uint)((int)fVar157 >= (int)fVar133) * (int)fVar133;
              uVar169 = ((int)uVar168 < (int)uVar180) * uVar180 |
                        ((int)uVar168 >= (int)uVar180) * uVar168;
              uVar172 = ((int)uVar171 < (int)uVar181) * uVar181 |
                        ((int)uVar171 >= (int)uVar181) * uVar171;
              uVar175 = ((int)uVar174 < (int)uVar182) * uVar182 |
                        ((int)uVar174 >= (int)uVar182) * uVar174;
              uVar178 = ((int)uVar177 < (int)uVar183) * uVar183 |
                        ((int)uVar177 >= (int)uVar183) * uVar177;
              uVar168 = (uint)((int)fVar135 < (int)fVar74) * (int)fVar74 |
                        (uint)((int)fVar135 >= (int)fVar74) * (int)fVar135;
              uVar171 = (uint)((int)fVar141 < (int)fVar87) * (int)fVar87 |
                        (uint)((int)fVar141 >= (int)fVar87) * (int)fVar141;
              uVar174 = (uint)((int)fVar142 < (int)fVar89) * (int)fVar89 |
                        (uint)((int)fVar142 >= (int)fVar89) * (int)fVar142;
              uVar177 = (uint)((int)fVar143 < (int)fVar91) * (int)fVar91 |
                        (uint)((int)fVar143 >= (int)fVar91) * (int)fVar143;
              uVar180 = (uint)((int)fVar159 < (int)fVar112) * (int)fVar112 |
                        (uint)((int)fVar159 >= (int)fVar112) * (int)fVar159;
              uVar181 = (uint)((int)fVar165 < (int)fVar119) * (int)fVar119 |
                        (uint)((int)fVar165 >= (int)fVar119) * (int)fVar165;
              uVar182 = (uint)((int)fVar166 < (int)fVar121) * (int)fVar121 |
                        (uint)((int)fVar166 >= (int)fVar121) * (int)fVar166;
              uVar183 = (uint)((int)fVar167 < (int)fVar123) * (int)fVar123 |
                        (uint)((int)fVar167 >= (int)fVar123) * (int)fVar167;
              uVar180 = ((int)uVar168 < (int)uVar180) * uVar168 |
                        ((int)uVar168 >= (int)uVar180) * uVar180;
              uVar181 = ((int)uVar171 < (int)uVar181) * uVar171 |
                        ((int)uVar171 >= (int)uVar181) * uVar181;
              uVar182 = ((int)uVar174 < (int)uVar182) * uVar174 |
                        ((int)uVar174 >= (int)uVar182) * uVar182;
              uVar183 = ((int)uVar177 < (int)uVar183) * uVar177 |
                        ((int)uVar177 >= (int)uVar183) * uVar183;
              uVar168 = (uint)((int)fVar145 < (int)fVar125) * (int)fVar125 |
                        (uint)((int)fVar145 >= (int)fVar125) * (int)fVar145;
              uVar171 = (uint)((int)fVar149 < (int)fVar129) * (int)fVar129 |
                        (uint)((int)fVar149 >= (int)fVar129) * (int)fVar149;
              uVar174 = (uint)((int)fVar154 < (int)fVar131) * (int)fVar131 |
                        (uint)((int)fVar154 >= (int)fVar131) * (int)fVar154;
              uVar177 = (uint)((int)fVar157 < (int)fVar133) * (int)fVar133 |
                        (uint)((int)fVar157 >= (int)fVar133) * (int)fVar157;
              uVar168 = ((int)uVar180 < (int)uVar168) * uVar180 |
                        ((int)uVar180 >= (int)uVar168) * uVar168;
              uVar171 = ((int)uVar181 < (int)uVar171) * uVar181 |
                        ((int)uVar181 >= (int)uVar171) * uVar171;
              uVar174 = ((int)uVar182 < (int)uVar174) * uVar182 |
                        ((int)uVar182 >= (int)uVar174) * uVar174;
              uVar177 = ((int)uVar183 < (int)uVar177) * uVar183 |
                        ((int)uVar183 >= (int)uVar177) * uVar177;
              bVar53 = (float)((tray.tnear.field_0.i[0] < (int)uVar169) * uVar169 |
                              (uint)(tray.tnear.field_0.i[0] >= (int)uVar169) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar168) *
                               tray.tfar.field_0.i[0] |
                              (tray.tfar.field_0.i[0] >= (int)uVar168) * uVar168);
              bVar6 = (float)((tray.tnear.field_0.i[1] < (int)uVar172) * uVar172 |
                             (uint)(tray.tnear.field_0.i[1] >= (int)uVar172) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar171) * tray.tfar.field_0.i[1]
                             | (tray.tfar.field_0.i[1] >= (int)uVar171) * uVar171);
              bVar7 = (float)((tray.tnear.field_0.i[2] < (int)uVar175) * uVar175 |
                             (uint)(tray.tnear.field_0.i[2] >= (int)uVar175) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar174) * tray.tfar.field_0.i[2]
                             | (tray.tfar.field_0.i[2] >= (int)uVar174) * uVar174);
              bVar8 = (float)((tray.tnear.field_0.i[3] < (int)uVar178) * uVar178 |
                             (uint)(tray.tnear.field_0.i[3] >= (int)uVar178) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar177) * tray.tfar.field_0.i[3]
                             | (tray.tfar.field_0.i[3] >= (int)uVar177) * uVar177);
              if (uVar60 == 6) {
                fVar91 = *(float *)((long)&(pIVar57->intersector16_filter).occluded + uVar58);
                fVar112 = *(float *)((long)&(pIVar57->intersector16_nofilter).intersect + uVar58);
                bVar53 = (fVar196 < fVar112 && fVar91 <= fVar196) && bVar53;
                bVar6 = (fVar198 < fVar112 && fVar91 <= fVar198) && bVar6;
                bVar7 = (fVar200 < fVar112 && fVar91 <= fVar200) && bVar7;
                bVar8 = (fVar202 < fVar112 && fVar91 <= fVar202) && bVar8;
              }
              auVar78._0_4_ = (-(uint)bVar53 & -(uint)(fVar144 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar78._4_4_ = (-(uint)bVar6 & -(uint)(fVar148 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar78._8_4_ = (-(uint)bVar7 & -(uint)(fVar153 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar78._12_4_ = (-(uint)bVar8 & -(uint)(fVar156 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar168 = movmskps((int)valid_i,auVar78);
              valid_i = (vint<4> *)(ulong)uVar168;
              sVar52 = sVar67;
              aVar108 = aVar225;
              if ((uVar168 != 0) &&
                 (auVar107._4_4_ = iVar218, auVar107._0_4_ = iVar216, auVar107._8_4_ = iVar220,
                 auVar107._12_4_ = iVar222, auVar11._4_4_ = uVar172, auVar11._0_4_ = uVar169,
                 auVar11._8_4_ = uVar175, auVar11._12_4_ = uVar178,
                 aVar108 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar107,auVar11,auVar78), sVar52 = sVar3, sVar67 != 8)) {
                pNVar71->ptr = sVar67;
                pNVar71 = pNVar71 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar73->v = aVar225;
                paVar73 = paVar73 + 1;
              }
              sVar67 = sVar52;
              pIVar57 = (Intersectors *)((long)&pIVar57->ptr + 4);
              aVar225 = aVar108;
            }
            pIVar61 = (Intersectors *)(ulong)uVar60;
            pIVar65 = pIVar57;
            if (sVar67 == 8) goto LAB_006ce161;
            auVar79._4_4_ = -(uint)(aVar225.v[1] < tray.tfar.field_0.v[1]);
            auVar79._0_4_ = -(uint)(aVar225.v[0] < tray.tfar.field_0.v[0]);
            auVar79._8_4_ = -(uint)(aVar225.v[2] < tray.tfar.field_0.v[2]);
            auVar79._12_4_ = -(uint)(aVar225.v[3] < tray.tfar.field_0.v[3]);
            uVar54 = movmskps((int)uVar58,auVar79);
            puVar56 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar54);
            root.ptr = sVar67;
          } while ((byte)pIVar63 < (byte)POPCOUNT(uVar54));
          pNVar71->ptr = sVar67;
          pNVar71 = pNVar71 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar73->v = aVar225;
          paVar73 = paVar73 + 1;
LAB_006ce161:
          puVar56 = &DAT_00000004;
        }
        else {
          while (uVar58 != 0) {
            k = (Intersectors *)0x0;
            if (uVar58 != 0) {
              for (; (uVar58 >> (long)k & 1) == 0; k = (Intersectors *)((long)&k->ptr + 1)) {
              }
            }
            uVar58 = uVar58 & uVar58 - 1;
            pIVar61 = k;
            bVar53 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            pIVar65 = extraout_RDX_01;
            if (bVar53) {
              terminated.field_0.i[(long)k] = -1;
            }
          }
          iVar55 = movmskps((int)pIVar61,(undefined1  [16])terminated.field_0);
          puVar56 = (undefined1 *)0x3;
          iVar216 = 0x7f800000;
          iVar218 = 0x7f800000;
          iVar220 = 0x7f800000;
          iVar222 = 0x7f800000;
          if (iVar55 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            puVar56 = (undefined1 *)0x2;
          }
          pIVar61 = pIVar57;
          valid_i = (vint<4> *)This;
          if (pIVar63 < pIVar57) goto LAB_006cdef4;
        }
      } while ((int)puVar56 != 3);
LAB_006cf5fc:
      auVar86._0_4_ = auVar94._0_4_ & terminated.field_0.i[0];
      auVar86._4_4_ = auVar94._4_4_ & terminated.field_0.i[1];
      auVar86._8_4_ = auVar94._8_4_ & terminated.field_0.i[2];
      auVar86._12_4_ = auVar94._12_4_ & terminated.field_0.i[3];
      auVar114 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar86);
      *(undefined1 (*) [16])(ray + 0x80) = auVar114;
    }
  }
  return;
LAB_006ce1c5:
  do {
    if (pIVar61 == (Intersectors *)valid_i) break;
    lVar68 = (long)pIVar61 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar177 = local_1908._4_4_;
    uVar180 = local_1908._8_4_;
    uVar181 = local_1908._12_4_;
    uVar54 = movmskps((int)puVar56,local_1908);
    uVar59 = CONCAT44((int)((ulong)puVar56 >> 0x20),uVar54);
    lVar72 = 0;
    uVar58 = uVar59;
    uVar60 = local_1908._0_4_;
    uVar168 = uVar177;
    uVar171 = uVar180;
    uVar174 = uVar181;
    do {
      if ((lVar72 == 4) ||
         (uVar182 = *(uint *)(lVar68 + 0x50 + lVar72 * 4), uVar58 = (ulong)uVar182,
         uVar182 == 0xffffffff)) break;
      pGVar4 = (context->scene->geometries).items[*(uint *)(lVar68 + 0x40 + lVar72 * 4)].ptr;
      fVar144 = pGVar4->fnumTimeSegments;
      fVar148 = (pGVar4->time_range).lower;
      auVar109._0_4_ = (pGVar4->time_range).upper - fVar148;
      auVar96._4_4_ = fVar148;
      auVar96._0_4_ = fVar148;
      auVar96._8_4_ = fVar148;
      auVar96._12_4_ = fVar148;
      auVar115._0_4_ = *(float *)(ray + 0x70) - fVar148;
      auVar115._4_4_ = *(float *)(ray + 0x74) - fVar148;
      auVar115._8_4_ = *(float *)(ray + 0x78) - fVar148;
      auVar115._12_4_ = *(float *)(ray + 0x7c) - fVar148;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar114 = divps(auVar115,auVar109);
      auVar116._0_4_ = auVar114._0_4_ * fVar144;
      auVar116._4_4_ = auVar114._4_4_ * fVar144;
      auVar116._8_4_ = auVar114._8_4_ * fVar144;
      auVar116._12_4_ = auVar114._12_4_ * fVar144;
      auVar114 = roundps(auVar96,auVar116,1);
      auVar137._0_4_ = fVar144 + -1.0;
      auVar137._4_4_ = auVar137._0_4_;
      auVar137._8_4_ = auVar137._0_4_;
      auVar137._12_4_ = auVar137._0_4_;
      auVar114 = minps(auVar114,auVar137);
      auVar114 = maxps(auVar114,_DAT_01f45a50);
      fVar144 = auVar116._0_4_ - auVar114._0_4_;
      fVar148 = auVar116._4_4_ - auVar114._4_4_;
      fVar153 = auVar116._8_4_ - auVar114._8_4_;
      fVar156 = auVar116._12_4_ - auVar114._12_4_;
      itime.field_0.i[0] = (int)auVar114._0_4_;
      itime.field_0.i[1] = (int)auVar114._4_4_;
      itime.field_0.i[2] = (int)auVar114._8_4_;
      itime.field_0.i[3] = (int)auVar114._12_4_;
      uVar58 = 0;
      if (uVar59 != 0) {
        for (; (uVar59 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
        }
      }
      iVar216 = itime.field_0.i[uVar58];
      auVar97._0_4_ = -(uint)(iVar216 == itime.field_0.i[0]);
      auVar97._4_4_ = -(uint)(iVar216 == itime.field_0.i[1]);
      auVar97._8_4_ = -(uint)(iVar216 == itime.field_0.i[2]);
      auVar97._12_4_ = -(uint)(iVar216 == itime.field_0.i[3]);
      iVar218 = movmskps((int)pIVar65,~auVar97 & local_1908);
      uVar62 = uVar59;
      uVar64 = uVar58;
      if (iVar218 == 0) {
        uVar58 = *(ulong *)(*(long *)&pGVar4[2].numPrimitives + (long)iVar216 * 0x38);
        lVar69 = *(long *)(*(long *)&pGVar4[2].numPrimitives + (long)iVar216 * 0x38 + 0x38);
        uVar62 = (ulong)*(uint *)(lVar68 + lVar72 * 4);
        uVar64 = (ulong)*(uint *)(lVar68 + 0x10 + lVar72 * 4);
        pfVar1 = (float *)(uVar58 + uVar62 * 4);
        fVar91 = *pfVar1;
        fVar112 = pfVar1[1];
        fVar123 = pfVar1[2];
        pfVar1 = (float *)(lVar69 + uVar62 * 4);
        fVar143 = *pfVar1;
        fVar145 = pfVar1[1];
        fVar125 = pfVar1[2];
        fVar126 = 1.0 - fVar144;
        fVar130 = 1.0 - fVar148;
        fVar132 = 1.0 - fVar153;
        fVar134 = 1.0 - fVar156;
        fVar121 = fVar91 * fVar126 + fVar143 * fVar144;
        fVar129 = fVar91 * fVar130 + fVar143 * fVar148;
        fVar131 = fVar91 * fVar132 + fVar143 * fVar153;
        fVar141 = fVar91 * fVar134 + fVar143 * fVar156;
        fVar149 = fVar112 * fVar126 + fVar145 * fVar144;
        fVar154 = fVar112 * fVar130 + fVar145 * fVar148;
        fVar157 = fVar112 * fVar132 + fVar145 * fVar153;
        fVar214 = fVar112 * fVar134 + fVar145 * fVar156;
        fVar91 = fVar123 * fVar126 + fVar125 * fVar144;
        fVar112 = fVar123 * fVar130 + fVar125 * fVar148;
        fVar143 = fVar123 * fVar132 + fVar125 * fVar153;
        fVar123 = fVar123 * fVar134 + fVar125 * fVar156;
        pfVar1 = (float *)(uVar58 + uVar64 * 4);
        fVar145 = *pfVar1;
        fVar125 = pfVar1[1];
        fVar133 = pfVar1[2];
        pfVar1 = (float *)(lVar69 + uVar64 * 4);
        fVar135 = *pfVar1;
        fVar202 = pfVar1[1];
        fVar119 = pfVar1[2];
        fVar142 = fVar145 * fVar126 + fVar135 * fVar144;
        fVar159 = fVar145 * fVar130 + fVar135 * fVar148;
        fVar165 = fVar145 * fVar132 + fVar135 * fVar153;
        fVar166 = fVar145 * fVar134 + fVar135 * fVar156;
        fVar196 = fVar125 * fVar126 + fVar202 * fVar144;
        fVar198 = fVar125 * fVar130 + fVar202 * fVar148;
        fVar200 = fVar125 * fVar132 + fVar202 * fVar153;
        fVar202 = fVar125 * fVar134 + fVar202 * fVar156;
        fVar74 = fVar133 * fVar126 + fVar119 * fVar144;
        fVar87 = fVar133 * fVar130 + fVar119 * fVar148;
        fVar89 = fVar133 * fVar132 + fVar119 * fVar153;
        fVar119 = fVar133 * fVar134 + fVar119 * fVar156;
        uVar64 = (ulong)*(uint *)(lVar68 + 0x20 + lVar72 * 4);
        pfVar1 = (float *)(uVar58 + uVar64 * 4);
        fVar145 = *pfVar1;
        fVar125 = pfVar1[1];
        fVar133 = pfVar1[2];
        pfVar1 = (float *)(lVar69 + uVar64 * 4);
        fVar135 = *pfVar1;
        fVar167 = pfVar1[1];
        fVar188 = pfVar1[2];
        local_1a78._4_4_ = fVar145 * fVar130 + fVar135 * fVar148;
        local_1a78._0_4_ = fVar145 * fVar126 + fVar135 * fVar144;
        fStack_1a70 = fVar145 * fVar132 + fVar135 * fVar153;
        fStack_1a6c = fVar145 * fVar134 + fVar135 * fVar156;
        local_19d8 = fVar125 * fVar126 + fVar167 * fVar144;
        fStack_19d4 = fVar125 * fVar130 + fVar167 * fVar148;
        fStack_19d0 = fVar125 * fVar132 + fVar167 * fVar153;
        fStack_19cc = fVar125 * fVar134 + fVar167 * fVar156;
        fStack_18f4 = fVar133 * fVar130 + fVar188 * fVar148;
        local_18f8 = fVar133 * fVar126 + fVar188 * fVar144;
        uStack_18f0._0_4_ = fVar133 * fVar132 + fVar188 * fVar153;
        uStack_18f0._4_4_ = fVar133 * fVar134 + fVar188 * fVar156;
        uVar64 = (ulong)*(uint *)(lVar68 + 0x30 + lVar72 * 4);
        pfVar1 = (float *)(uVar58 + uVar64 * 4);
        fVar145 = *pfVar1;
        fVar125 = pfVar1[1];
        fVar133 = pfVar1[2];
        pfVar1 = (float *)(lVar69 + uVar64 * 4);
        fVar135 = *pfVar1;
        fVar208 = pfVar1[1];
        fVar186 = pfVar1[2];
        fVar184 = fVar145 * fVar126 + fVar135 * fVar144;
        fVar189 = fVar145 * fVar130 + fVar135 * fVar148;
        fVar191 = fVar145 * fVar132 + fVar135 * fVar153;
        fVar194 = fVar145 * fVar134 + fVar135 * fVar156;
        fVar167 = fVar125 * fVar126 + fVar208 * fVar144;
        fVar188 = fVar125 * fVar130 + fVar208 * fVar148;
        fVar193 = fVar125 * fVar132 + fVar208 * fVar153;
        fVar208 = fVar125 * fVar134 + fVar208 * fVar156;
        fVar144 = fVar133 * fVar126 + fVar186 * fVar144;
        fVar148 = fVar133 * fVar130 + fVar186 * fVar148;
        fVar153 = fVar133 * fVar132 + fVar186 * fVar153;
        fVar156 = fVar133 * fVar134 + fVar186 * fVar156;
      }
      else {
        while (uVar62 != 0) {
          lVar69 = (long)itime.field_0.i[uVar64] * 0x38;
          uVar70 = (ulong)*(uint *)(lVar68 + lVar72 * 4);
          puVar2 = (undefined4 *)
                   (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69) + uVar70 * 4);
          uVar54 = puVar2[1];
          uVar24 = puVar2[2];
          auVar114 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69 + 0x38) + uVar70 * 4);
          *(undefined4 *)((long)&p0.field_0 + uVar64 * 4) = *puVar2;
          *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar54;
          *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar24;
          *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar114._0_4_;
          uVar66 = extractps(auVar114,1);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar114,2);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar66;
          uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
          uVar64 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
        }
        fVar145 = 1.0 - fVar144;
        fVar125 = 1.0 - fVar148;
        fVar133 = 1.0 - fVar153;
        fVar135 = 1.0 - fVar156;
        uVar35 = p0.field_0._0_4_;
        uVar36 = p0.field_0._4_4_;
        uVar37 = p0.field_0._8_4_;
        uVar38 = p0.field_0._12_4_;
        uVar39 = p0.field_0._32_4_;
        uVar42 = p0.field_0._36_4_;
        uVar45 = p0.field_0._40_4_;
        uVar48 = p0.field_0._44_4_;
        uVar54 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar33 = p1.field_0._8_4_;
        uVar34 = p1.field_0._12_4_;
        fVar149 = (float)p1.field_0._16_4_ * fVar144 + (float)p0.field_0._16_4_ * fVar145;
        fVar154 = (float)p1.field_0._20_4_ * fVar148 + (float)p0.field_0._20_4_ * fVar125;
        fVar157 = (float)p1.field_0._24_4_ * fVar153 + (float)p0.field_0._24_4_ * fVar133;
        fVar214 = (float)p1.field_0._28_4_ * fVar156 + (float)p0.field_0._28_4_ * fVar135;
        fVar91 = (float)p1.field_0._32_4_ * fVar144;
        fVar112 = (float)p1.field_0._36_4_ * fVar148;
        fVar143 = (float)p1.field_0._40_4_ * fVar153;
        fVar123 = (float)p1.field_0._44_4_ * fVar156;
        uVar62 = uVar59;
        uVar64 = uVar58;
        while (uVar62 != 0) {
          lVar69 = (long)itime.field_0.i[uVar64] * 0x38;
          uVar70 = (ulong)*(uint *)(lVar68 + 0x10 + lVar72 * 4);
          auVar114 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69) + uVar70 * 4);
          auVar227 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69 + 0x38) + uVar70 * 4);
          *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar114._0_4_;
          uVar66 = extractps(auVar114,1);
          *(undefined8 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar114,2);
          *(undefined8 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar66;
          *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar227._0_4_;
          uVar66 = extractps(auVar227,1);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar227,2);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar66;
          uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
          uVar64 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
        }
        fVar121 = (float)uVar54 * fVar144 + (float)uVar35 * fVar145;
        fVar129 = (float)uVar24 * fVar148 + (float)uVar36 * fVar125;
        fVar131 = (float)uVar33 * fVar153 + (float)uVar37 * fVar133;
        fVar141 = (float)uVar34 * fVar156 + (float)uVar38 * fVar135;
        uVar35 = p0.field_0._0_4_;
        uVar36 = p0.field_0._4_4_;
        uVar37 = p0.field_0._8_4_;
        uVar38 = p0.field_0._12_4_;
        uVar40 = p0.field_0._32_4_;
        uVar43 = p0.field_0._36_4_;
        uVar46 = p0.field_0._40_4_;
        uVar49 = p0.field_0._44_4_;
        uVar54 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar33 = p1.field_0._8_4_;
        uVar34 = p1.field_0._12_4_;
        fVar196 = (float)p1.field_0._16_4_ * fVar144 + (float)p0.field_0._16_4_ * fVar145;
        fVar198 = (float)p1.field_0._20_4_ * fVar148 + (float)p0.field_0._20_4_ * fVar125;
        fVar200 = (float)p1.field_0._24_4_ * fVar153 + (float)p0.field_0._24_4_ * fVar133;
        fVar202 = (float)p1.field_0._28_4_ * fVar156 + (float)p0.field_0._28_4_ * fVar135;
        fVar74 = (float)p1.field_0._32_4_ * fVar144;
        fVar87 = (float)p1.field_0._36_4_ * fVar148;
        fVar89 = (float)p1.field_0._40_4_ * fVar153;
        fVar119 = (float)p1.field_0._44_4_ * fVar156;
        uVar62 = uVar59;
        uVar64 = uVar58;
        while (uVar62 != 0) {
          lVar69 = (long)itime.field_0.i[uVar64] * 0x38;
          uVar70 = (ulong)*(uint *)(lVar68 + 0x20 + lVar72 * 4);
          auVar114 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69) + uVar70 * 4);
          auVar227 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69 + 0x38) + uVar70 * 4);
          *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar114._0_4_;
          uVar66 = extractps(auVar114,1);
          *(undefined8 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar114,2);
          *(undefined8 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar66;
          *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar227._0_4_;
          uVar66 = extractps(auVar227,1);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar227,2);
          *(undefined8 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar66;
          uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
          uVar64 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
        }
        fVar142 = (float)uVar54 * fVar144 + (float)uVar35 * fVar145;
        fVar159 = (float)uVar24 * fVar148 + (float)uVar36 * fVar125;
        fVar165 = (float)uVar33 * fVar153 + (float)uVar37 * fVar133;
        fVar166 = (float)uVar34 * fVar156 + (float)uVar38 * fVar135;
        uVar35 = p0.field_0._0_4_;
        uVar36 = p0.field_0._4_4_;
        uVar37 = p0.field_0._8_4_;
        uVar38 = p0.field_0._12_4_;
        uVar41 = p0.field_0._32_4_;
        uVar44 = p0.field_0._36_4_;
        uVar47 = p0.field_0._40_4_;
        uVar50 = p0.field_0._44_4_;
        uVar54 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar33 = p1.field_0._8_4_;
        uVar34 = p1.field_0._12_4_;
        local_19d8 = (float)p1.field_0._16_4_ * fVar144 + (float)p0.field_0._16_4_ * fVar145;
        fStack_19d4 = (float)p1.field_0._20_4_ * fVar148 + (float)p0.field_0._20_4_ * fVar125;
        fStack_19d0 = (float)p1.field_0._24_4_ * fVar153 + (float)p0.field_0._24_4_ * fVar133;
        fStack_19cc = (float)p1.field_0._28_4_ * fVar156 + (float)p0.field_0._28_4_ * fVar135;
        fVar167 = (float)p1.field_0._32_4_ * fVar144;
        fVar188 = (float)p1.field_0._36_4_ * fVar148;
        fVar193 = (float)p1.field_0._40_4_ * fVar153;
        fVar208 = (float)p1.field_0._44_4_ * fVar156;
        uVar62 = uVar59;
        while (uVar62 != 0) {
          lVar69 = (long)itime.field_0.i[uVar58] * 0x38;
          uVar64 = *(ulong *)(*(long *)&pGVar4[2].numPrimitives + lVar69 + 0x38);
          uVar70 = (ulong)*(uint *)(lVar68 + 0x30 + lVar72 * 4);
          auVar114 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar4[2].numPrimitives + lVar69) + uVar70 * 4);
          auVar227 = *(undefined1 (*) [16])(uVar64 + uVar70 * 4);
          *(int *)((long)&p0.field_0 + uVar58 * 4) = auVar114._0_4_;
          uVar66 = extractps(auVar114,1);
          *(undefined8 *)((long)&p0.field_0 + uVar58 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar114,2);
          *(undefined8 *)((long)&p0.field_0 + uVar58 * 4 + 0x20) = uVar66;
          *(int *)((long)&p1.field_0 + uVar58 * 4) = auVar227._0_4_;
          uVar66 = extractps(auVar227,1);
          *(undefined8 *)((long)&p1.field_0 + uVar58 * 4 + 0x10) = uVar66;
          uVar66 = extractps(auVar227,2);
          *(undefined8 *)((long)&p1.field_0 + uVar58 * 4 + 0x20) = uVar66;
          uVar62 = uVar62 ^ 1L << (uVar58 & 0x3f);
          uVar58 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
            }
          }
        }
        fVar91 = (float)uVar39 * fVar145 + fVar91;
        fVar112 = (float)uVar42 * fVar125 + fVar112;
        fVar143 = (float)uVar45 * fVar133 + fVar143;
        fVar123 = (float)uVar48 * fVar135 + fVar123;
        fVar74 = (float)uVar40 * fVar145 + fVar74;
        fVar87 = (float)uVar43 * fVar125 + fVar87;
        fVar89 = (float)uVar46 * fVar133 + fVar89;
        fVar119 = (float)uVar49 * fVar135 + fVar119;
        fStack_18f4 = (float)uVar44 * fVar125 + fVar188;
        local_18f8 = (float)uVar41 * fVar145 + fVar167;
        uStack_18f0._0_4_ = (float)uVar47 * fVar133 + fVar193;
        uStack_18f0._4_4_ = (float)uVar50 * fVar135 + fVar208;
        local_1a78._4_4_ = (float)uVar24 * fVar148 + (float)uVar36 * fVar125;
        local_1a78._0_4_ = (float)uVar54 * fVar144 + (float)uVar35 * fVar145;
        fStack_1a70 = (float)uVar33 * fVar153 + (float)uVar37 * fVar133;
        fStack_1a6c = (float)uVar34 * fVar156 + (float)uVar38 * fVar135;
        fVar184 = (float)p1.field_0._0_4_ * fVar144 + (float)p0.field_0._0_4_ * fVar145;
        fVar189 = (float)p1.field_0._4_4_ * fVar148 + (float)p0.field_0._4_4_ * fVar125;
        fVar191 = (float)p1.field_0._8_4_ * fVar153 + (float)p0.field_0._8_4_ * fVar133;
        fVar194 = (float)p1.field_0._12_4_ * fVar156 + (float)p0.field_0._12_4_ * fVar135;
        fVar167 = (float)p1.field_0._16_4_ * fVar144 + (float)p0.field_0._16_4_ * fVar145;
        fVar188 = (float)p1.field_0._20_4_ * fVar148 + (float)p0.field_0._20_4_ * fVar125;
        fVar193 = (float)p1.field_0._24_4_ * fVar153 + (float)p0.field_0._24_4_ * fVar133;
        fVar208 = (float)p1.field_0._28_4_ * fVar156 + (float)p0.field_0._28_4_ * fVar135;
        fVar144 = fVar144 * (float)p1.field_0._32_4_ + fVar145 * (float)p0.field_0._32_4_;
        fVar148 = fVar148 * (float)p1.field_0._36_4_ + fVar125 * (float)p0.field_0._36_4_;
        fVar153 = fVar153 * (float)p1.field_0._40_4_ + fVar133 * (float)p0.field_0._40_4_;
        fVar156 = fVar156 * (float)p1.field_0._44_4_ + fVar135 * (float)p0.field_0._44_4_;
      }
      auVar232._8_8_ = uVar64;
      auVar232._0_8_ = pGVar4;
      fVar113 = fVar121 - fVar142;
      fVar120 = fVar129 - fVar159;
      fVar122 = fVar131 - fVar165;
      fVar124 = fVar141 - fVar166;
      fVar75 = fVar149 - fVar196;
      fVar88 = fVar154 - fVar198;
      fVar90 = fVar157 - fVar200;
      fVar92 = fVar214 - fVar202;
      fVar197 = fVar91 - fVar74;
      fVar199 = fVar112 - fVar87;
      fVar201 = fVar143 - fVar89;
      fVar203 = fVar123 - fVar119;
      fVar185 = fVar184 - fVar121;
      fVar190 = fVar189 - fVar129;
      fVar192 = fVar191 - fVar131;
      fVar195 = fVar194 - fVar141;
      fVar204 = fVar167 - fVar149;
      fVar205 = fVar188 - fVar154;
      fVar206 = fVar193 - fVar157;
      fVar209 = fVar208 - fVar214;
      fVar170 = fVar144 - fVar91;
      fVar173 = fVar148 - fVar112;
      fVar176 = fVar153 - fVar143;
      fVar179 = fVar156 - fVar123;
      fVar93 = fVar204 * fVar197 - fVar75 * fVar170;
      fVar104 = fVar205 * fVar199 - fVar88 * fVar173;
      vVar163.field_0.v[1] = fVar104;
      vVar163.field_0.v[0] = fVar93;
      fVar105 = fVar206 * fVar201 - fVar90 * fVar176;
      fVar106 = fVar209 * fVar203 - fVar92 * fVar179;
      fVar146 = fVar113 * fVar170 - fVar185 * fVar197;
      fVar150 = fVar120 * fVar173 - fVar190 * fVar199;
      fVar155 = fVar122 * fVar176 - fVar192 * fVar201;
      fVar158 = fVar124 * fVar179 - fVar195 * fVar203;
      vVar117.field_0._0_4_ = fVar185 * fVar75 - fVar113 * fVar204;
      vVar117.field_0._4_4_ = fVar190 * fVar88 - fVar120 * fVar205;
      vVar117.field_0._8_4_ = fVar192 * fVar90 - fVar122 * fVar206;
      vVar117.field_0._12_4_ = fVar195 * fVar92 - fVar124 * fVar209;
      fVar121 = fVar121 - *(float *)ray;
      fVar129 = fVar129 - *(float *)(ray + 4);
      fVar131 = fVar131 - *(float *)(ray + 8);
      fVar141 = fVar141 - *(float *)(ray + 0xc);
      fVar149 = fVar149 - *(float *)(ray + 0x10);
      fVar154 = fVar154 - *(float *)(ray + 0x14);
      fVar157 = fVar157 - *(float *)(ray + 0x18);
      fVar214 = fVar214 - *(float *)(ray + 0x1c);
      fVar91 = fVar91 - *(float *)(ray + 0x20);
      fVar112 = fVar112 - *(float *)(ray + 0x24);
      fVar143 = fVar143 - *(float *)(ray + 0x28);
      fVar123 = fVar123 - *(float *)(ray + 0x2c);
      fVar145 = *(float *)(ray + 0x40);
      fVar125 = *(float *)(ray + 0x44);
      fVar133 = *(float *)(ray + 0x48);
      fVar135 = *(float *)(ray + 0x4c);
      fVar186 = *(float *)(ray + 0x50);
      fVar126 = *(float *)(ray + 0x54);
      fVar130 = *(float *)(ray + 0x58);
      fVar132 = *(float *)(ray + 0x5c);
      fVar134 = *(float *)(ray + 0x60);
      fVar147 = *(float *)(ray + 100);
      fVar151 = *(float *)(ray + 0x68);
      fVar152 = *(float *)(ray + 0x6c);
      fVar211 = fVar149 * fVar134 - fVar91 * fVar186;
      fVar212 = fVar154 * fVar147 - fVar112 * fVar126;
      fVar213 = fVar157 * fVar151 - fVar143 * fVar130;
      fVar215 = fVar214 * fVar152 - fVar123 * fVar132;
      fVar217 = fVar91 * fVar145 - fVar121 * fVar134;
      fVar219 = fVar112 * fVar125 - fVar129 * fVar147;
      fVar221 = fVar143 * fVar133 - fVar131 * fVar151;
      fVar223 = fVar123 * fVar135 - fVar141 * fVar152;
      fVar224 = fVar121 * fVar186 - fVar149 * fVar145;
      fVar228 = fVar129 * fVar126 - fVar154 * fVar125;
      fVar229 = fVar131 * fVar130 - fVar157 * fVar133;
      fVar230 = fVar141 * fVar132 - fVar214 * fVar135;
      fVar145 = fVar145 * fVar93 + fVar186 * fVar146 + fVar134 * vVar117.field_0._0_4_;
      fVar125 = fVar125 * fVar104 + fVar126 * fVar150 + fVar147 * vVar117.field_0._4_4_;
      fVar133 = fVar133 * fVar105 + fVar130 * fVar155 + fVar151 * vVar117.field_0._8_4_;
      fVar135 = fVar135 * fVar106 + fVar132 * fVar158 + fVar152 * vVar117.field_0._12_4_;
      uVar182 = (uint)fVar145 & 0x80000000;
      uVar183 = (uint)fVar125 & 0x80000000;
      uVar169 = (uint)fVar133 & 0x80000000;
      uVar172 = (uint)fVar135 & 0x80000000;
      fVar186 = (float)((uint)(fVar185 * fVar211 + fVar204 * fVar217 + fVar170 * fVar224) ^ uVar182)
      ;
      fVar126 = (float)((uint)(fVar190 * fVar212 + fVar205 * fVar219 + fVar173 * fVar228) ^ uVar183)
      ;
      fVar130 = (float)((uint)(fVar192 * fVar213 + fVar206 * fVar221 + fVar176 * fVar229) ^ uVar169)
      ;
      fVar132 = (float)((uint)(fVar195 * fVar215 + fVar209 * fVar223 + fVar179 * fVar230) ^ uVar172)
      ;
      uVar175 = -(uint)(0.0 <= fVar186) & uVar60;
      uVar178 = -(uint)(0.0 <= fVar126) & uVar168;
      uVar207 = -(uint)(0.0 <= fVar130) & uVar171;
      uVar210 = -(uint)(0.0 <= fVar132) & uVar174;
      uVar54 = (undefined4)(uVar58 >> 0x20);
      auVar18._4_4_ = uVar178;
      auVar18._0_4_ = uVar175;
      auVar18._8_4_ = uVar207;
      auVar18._12_4_ = uVar210;
      iVar216 = movmskps((int)uVar58,auVar18);
      if (iVar216 == 0) {
LAB_006ce5aa:
        auVar28._4_4_ = uVar54;
        auVar28._0_4_ = iVar216;
        auVar28._8_8_ = uVar64;
      }
      else {
        vVar23.field_0.v[1] = fVar150;
        vVar23.field_0.v[0] = fVar146;
        fVar134 = (float)((uint)(fVar113 * fVar211 + fVar75 * fVar217 + fVar197 * fVar224) ^ uVar182
                         );
        fVar147 = (float)((uint)(fVar120 * fVar212 + fVar88 * fVar219 + fVar199 * fVar228) ^ uVar183
                         );
        fVar151 = (float)((uint)(fVar122 * fVar213 + fVar90 * fVar221 + fVar201 * fVar229) ^ uVar169
                         );
        fVar152 = (float)((uint)(fVar124 * fVar215 + fVar92 * fVar223 + fVar203 * fVar230) ^ uVar172
                         );
        uVar175 = -(uint)(0.0 <= fVar134) & uVar175;
        uVar178 = -(uint)(0.0 <= fVar147) & uVar178;
        uVar207 = -(uint)(0.0 <= fVar151) & uVar207;
        uVar210 = -(uint)(0.0 <= fVar152) & uVar210;
        auVar22._4_4_ = uVar178;
        auVar22._0_4_ = uVar175;
        auVar22._8_4_ = uVar207;
        auVar22._12_4_ = uVar210;
        iVar216 = movmskps(iVar216,auVar22);
        if (iVar216 == 0) goto LAB_006ce5aa;
        fVar75 = ABS(fVar145);
        fVar88 = ABS(fVar125);
        fVar90 = ABS(fVar133);
        fVar92 = ABS(fVar135);
        uVar175 = -(uint)(fVar134 <= fVar75 - fVar186) & uVar175;
        uVar178 = -(uint)(fVar147 <= fVar88 - fVar126) & uVar178;
        uVar207 = -(uint)(fVar151 <= fVar90 - fVar130) & uVar207;
        uVar210 = -(uint)(fVar152 <= fVar92 - fVar132) & uVar210;
        auVar17._4_4_ = uVar178;
        auVar17._0_4_ = uVar175;
        auVar17._8_4_ = uVar207;
        auVar17._12_4_ = uVar210;
        iVar216 = movmskps(iVar216,auVar17);
        auVar28._4_4_ = uVar54;
        auVar28._0_4_ = iVar216;
        auVar28._8_8_ = uVar64;
        if (iVar216 != 0) {
          vVar163.field_0.v[2] = fVar105;
          vVar163.field_0.v[3] = fVar106;
          fVar91 = (float)(uVar182 ^
                          (uint)(fVar121 * fVar93 +
                                fVar149 * fVar146 + fVar91 * vVar117.field_0._0_4_));
          fVar112 = (float)(uVar183 ^
                           (uint)(fVar129 * fVar104 +
                                 fVar154 * fVar150 + fVar112 * vVar117.field_0._4_4_));
          fVar143 = (float)(uVar169 ^
                           (uint)(fVar131 * fVar105 +
                                 fVar157 * fVar155 + fVar143 * vVar117.field_0._8_4_));
          fVar123 = (float)(uVar172 ^
                           (uint)(fVar141 * fVar106 +
                                 fVar214 * fVar158 + fVar123 * vVar117.field_0._12_4_));
          auVar82._0_4_ =
               -(uint)(fVar91 <= *(float *)(ray + 0x80) * fVar75 &&
                      *(float *)(ray + 0x30) * fVar75 < fVar91) & uVar175;
          auVar82._4_4_ =
               -(uint)(fVar112 <= *(float *)(ray + 0x84) * fVar88 &&
                      *(float *)(ray + 0x34) * fVar88 < fVar112) & uVar178;
          auVar82._8_4_ =
               -(uint)(fVar143 <= *(float *)(ray + 0x88) * fVar90 &&
                      *(float *)(ray + 0x38) * fVar90 < fVar143) & uVar207;
          auVar82._12_4_ =
               -(uint)(fVar123 <= *(float *)(ray + 0x8c) * fVar92 &&
                      *(float *)(ray + 0x3c) * fVar92 < fVar123) & uVar210;
          iVar216 = movmskps(iVar216,auVar82);
          auVar28._0_4_ = iVar216;
          if (iVar216 != 0) {
            uVar182 = -(uint)(fVar145 != 0.0) & auVar82._0_4_;
            uVar183 = -(uint)(fVar125 != 0.0) & auVar82._4_4_;
            uVar169 = -(uint)(fVar133 != 0.0) & auVar82._8_4_;
            uVar172 = -(uint)(fVar135 != 0.0) & auVar82._12_4_;
            auVar14._4_4_ = uVar183;
            auVar14._0_4_ = uVar182;
            auVar14._8_4_ = uVar169;
            auVar14._12_4_ = uVar172;
            iVar216 = movmskps(iVar216,auVar14);
            auVar28._0_4_ = iVar216;
            if (iVar216 != 0) {
              uVar175 = pGVar4->mask;
              auVar83._0_4_ = -(uint)((uVar175 & *(uint *)(ray + 0x90)) == 0);
              auVar83._4_4_ = -(uint)((uVar175 & *(uint *)(ray + 0x94)) == 0);
              auVar83._8_4_ = -(uint)((uVar175 & *(uint *)(ray + 0x98)) == 0);
              auVar83._12_4_ = -(uint)((uVar175 & *(uint *)(ray + 0x9c)) == 0);
              auVar15._4_4_ = uVar183;
              auVar15._0_4_ = uVar182;
              auVar15._8_4_ = uVar169;
              auVar15._12_4_ = uVar172;
              local_19e8 = ~auVar83 & auVar15;
              iVar216 = movmskps((int)pGVar4,local_19e8);
              auVar28._4_4_ = (int)((ulong)pGVar4 >> 0x20);
              auVar28._0_4_ = iVar216;
              if (iVar216 != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar19._4_4_ = fVar88;
                  auVar19._0_4_ = fVar75;
                  auVar19._8_4_ = fVar90;
                  auVar19._12_4_ = fVar92;
                  auVar114 = rcpps(local_19e8,auVar19);
                  fVar91 = auVar114._0_4_;
                  fVar112 = auVar114._4_4_;
                  fVar143 = auVar114._8_4_;
                  fVar123 = auVar114._12_4_;
                  fVar125 = (float)DAT_01f46a60;
                  fVar133 = DAT_01f46a60._4_4_;
                  fVar135 = DAT_01f46a60._12_4_;
                  fVar145 = DAT_01f46a60._8_4_;
                  fVar91 = (fVar125 - fVar75 * fVar91) * fVar91 + fVar91;
                  fVar112 = (fVar133 - fVar88 * fVar112) * fVar112 + fVar112;
                  fVar143 = (fVar145 - fVar90 * fVar143) * fVar143 + fVar143;
                  fVar123 = (fVar135 - fVar92 * fVar123) * fVar123 + fVar123;
                  auVar187._0_4_ = fVar186 * fVar91;
                  auVar187._4_4_ = fVar126 * fVar112;
                  auVar187._8_4_ = fVar130 * fVar143;
                  auVar187._12_4_ = fVar132 * fVar123;
                  auVar227 = minps(auVar187,_DAT_01f46a60);
                  auVar99._0_4_ = fVar91 * fVar134;
                  auVar99._4_4_ = fVar112 * fVar147;
                  auVar99._8_4_ = fVar143 * fVar151;
                  auVar99._12_4_ = fVar123 * fVar152;
                  auVar114 = minps(auVar99,_DAT_01f46a60);
                  auVar111._0_4_ = fVar125 - auVar227._0_4_;
                  auVar111._4_4_ = fVar133 - auVar227._4_4_;
                  auVar111._8_4_ = fVar145 - auVar227._8_4_;
                  auVar111._12_4_ = fVar135 - auVar227._12_4_;
                  auVar128._0_4_ = fVar125 - auVar114._0_4_;
                  auVar128._4_4_ = fVar133 - auVar114._4_4_;
                  auVar128._8_4_ = fVar145 - auVar114._8_4_;
                  auVar128._12_4_ = fVar135 - auVar114._12_4_;
                  auVar26._8_8_ = uVar30;
                  auVar26._0_8_ = uVar29;
                  blendvps(auVar227,auVar111,auVar26);
                  blendvps(auVar114,auVar128,auVar26);
                  vVar23.field_0.v[2] = fVar155;
                  vVar23.field_0.v[3] = fVar158;
                  p1.field_0._0_8_ = &itime;
                  p1.field_0._8_8_ = &t;
                  p1.field_0._16_8_ = &v_1;
                  p1.field_0._24_8_ = &u;
                  p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar163.field_0;
                  p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar23.field_0;
                  p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar117.field_0;
                  std::
                  _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                  ::
                  _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                            ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                              *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                     *)&p0);
                  p0.field_0._4_4_ = itime.field_0.i[1];
                  p0.field_0._0_4_ = itime.field_0.i[0];
                  p0.field_0._12_4_ = itime.field_0.i[3];
                  p0.field_0._8_4_ = itime.field_0.i[2];
                  p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1868.field_0;
                  p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)local_1858.field_0;
                  auVar114 = *(undefined1 (*) [16])(ray + 0x80);
                  auVar227 = blendvps(auVar114,(undefined1  [16])t.field_0,local_19e8);
                  *(undefined1 (*) [16])(ray + 0x80) = auVar227;
                  p1.field_0._0_8_ = local_19a8;
                  p1.field_0._8_8_ = pGVar4->userPtr;
                  p1.field_0._16_8_ = context->user;
                  p1.field_0._32_8_ = &p0;
                  p1.field_0._40_4_ = 4;
                  p_Var5 = pGVar4->occlusionFilterN;
                  auVar232._8_8_ = pGVar4;
                  auVar232._0_8_ = p_Var5;
                  p1.field_0._24_8_ = ray;
                  local_19a8 = local_19e8;
                  if (p_Var5 != (RTCFilterFunctionN)0x0) {
                    auVar232 = (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                  }
                  uVar66 = auVar232._8_8_;
                  if (local_19a8 == (undefined1  [16])0x0) {
                    auVar100._8_4_ = 0xffffffff;
                    auVar100._0_8_ = 0xffffffffffffffff;
                    auVar100._12_4_ = 0xffffffff;
                    auVar100 = auVar100 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                      uVar66 = extraout_RDX_00;
                    }
                    auVar232._8_8_ = uVar66;
                    auVar232._0_8_ = p1.field_0._24_8_;
                    local_19e8._0_4_ = local_19a8._0_4_;
                    local_19e8._4_4_ = local_19a8._4_4_;
                    local_19e8._8_4_ = local_19a8._8_4_;
                    local_19e8._12_4_ = local_19a8._12_4_;
                    auVar85._0_4_ = -(uint)(local_19e8._0_4_ == 0);
                    auVar85._4_4_ = -(uint)(local_19e8._4_4_ == 0);
                    auVar85._8_4_ = -(uint)(local_19e8._8_4_ == 0);
                    auVar85._12_4_ = -(uint)(local_19e8._12_4_ == 0);
                    auVar100 = auVar85 ^ _DAT_01f46b70;
                    auVar227 = blendvps(_DAT_01f45a40,
                                        *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),auVar85);
                    *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar227;
                  }
                  auVar102._0_4_ = auVar100._0_4_ << 0x1f;
                  auVar102._4_4_ = auVar100._4_4_ << 0x1f;
                  auVar102._8_4_ = auVar100._8_4_ << 0x1f;
                  auVar102._12_4_ = auVar100._12_4_ << 0x1f;
                  local_19e8._4_4_ = auVar102._4_4_ >> 0x1f;
                  local_19e8._0_4_ = auVar102._0_4_ >> 0x1f;
                  local_19e8._8_4_ = auVar102._8_4_ >> 0x1f;
                  local_19e8._12_4_ = auVar102._12_4_ >> 0x1f;
                  auVar114 = blendvps(auVar114,*(undefined1 (*) [16])(ray + 0x80),auVar102);
                  *(undefined1 (*) [16])(ray + 0x80) = auVar114;
                }
                uVar60 = ~local_19e8._0_4_ & uVar60;
                uVar168 = ~local_19e8._4_4_ & uVar168;
                uVar171 = ~local_19e8._8_4_ & uVar171;
                uVar174 = ~local_19e8._12_4_ & uVar174;
                auVar28 = auVar232;
              }
            }
          }
        }
      }
      pIVar65 = auVar28._8_8_;
      iVar222 = 0x7f800000;
      iVar220 = 0x7f800000;
      iVar218 = 0x7f800000;
      iVar216 = 0x7f800000;
      uVar54 = auVar28._4_4_;
      auVar20._4_4_ = uVar168;
      auVar20._0_4_ = uVar60;
      auVar20._8_4_ = uVar171;
      auVar20._12_4_ = uVar174;
      iVar55 = movmskps(auVar28._0_4_,auVar20);
      uVar58 = CONCAT44(uVar54,iVar55);
      if (iVar55 == 0) break;
      fVar184 = (float)local_1a78._0_4_ - fVar184;
      fVar189 = (float)local_1a78._4_4_ - fVar189;
      fVar191 = fStack_1a70 - fVar191;
      fVar194 = fStack_1a6c - fVar194;
      fVar167 = local_19d8 - fVar167;
      fVar188 = fStack_19d4 - fVar188;
      fVar193 = fStack_19d0 - fVar193;
      fVar208 = fStack_19cc - fVar208;
      fVar144 = local_18f8 - fVar144;
      fVar148 = fStack_18f4 - fVar148;
      fVar153 = (float)uStack_18f0 - fVar153;
      fVar156 = uStack_18f0._4_4_ - fVar156;
      fVar142 = fVar142 - (float)local_1a78._0_4_;
      fVar159 = fVar159 - (float)local_1a78._4_4_;
      fVar165 = fVar165 - fStack_1a70;
      fVar166 = fVar166 - fStack_1a6c;
      fVar196 = fVar196 - local_19d8;
      fVar198 = fVar198 - fStack_19d4;
      fVar200 = fVar200 - fStack_19d0;
      fVar202 = fVar202 - fStack_19cc;
      fVar74 = fVar74 - local_18f8;
      fVar87 = fVar87 - fStack_18f4;
      fVar89 = fVar89 - (float)uStack_18f0;
      fVar119 = fVar119 - uStack_18f0._4_4_;
      fVar130 = fVar144 * fVar196 - fVar167 * fVar74;
      fVar132 = fVar148 * fVar198 - fVar188 * fVar87;
      auVar138._0_8_ = CONCAT44(fVar132,fVar130);
      auVar138._8_4_ = fVar153 * fVar200 - fVar193 * fVar89;
      auVar138._12_4_ = fVar156 * fVar202 - fVar208 * fVar119;
      fVar121 = fVar184 * fVar74 - fVar144 * fVar142;
      fVar129 = fVar189 * fVar87 - fVar148 * fVar159;
      auVar110._0_8_ = CONCAT44(fVar129,fVar121);
      auVar110._8_4_ = fVar191 * fVar89 - fVar153 * fVar165;
      auVar110._12_4_ = fVar194 * fVar119 - fVar156 * fVar166;
      fVar131 = fVar167 * fVar142 - fVar184 * fVar196;
      fVar141 = fVar188 * fVar159 - fVar189 * fVar198;
      fVar186 = fVar193 * fVar165 - fVar191 * fVar200;
      fVar126 = fVar208 * fVar166 - fVar194 * fVar202;
      fVar134 = (float)local_1a78._0_4_ - *(float *)ray;
      fVar151 = (float)local_1a78._4_4_ - *(float *)(ray + 4);
      fStack_1a70 = fStack_1a70 - *(float *)(ray + 8);
      fStack_1a6c = fStack_1a6c - *(float *)(ray + 0xc);
      local_19d8 = local_19d8 - *(float *)(ray + 0x10);
      fStack_19d4 = fStack_19d4 - *(float *)(ray + 0x14);
      fStack_19d0 = fStack_19d0 - *(float *)(ray + 0x18);
      fStack_19cc = fStack_19cc - *(float *)(ray + 0x1c);
      local_18f8 = local_18f8 - *(float *)(ray + 0x20);
      fStack_18f4 = fStack_18f4 - *(float *)(ray + 0x24);
      uStack_18f0._0_4_ = (float)uStack_18f0 - *(float *)(ray + 0x28);
      uStack_18f0._4_4_ = uStack_18f0._4_4_ - *(float *)(ray + 0x2c);
      fVar91 = *(float *)(ray + 0x40);
      fVar112 = *(float *)(ray + 0x44);
      fVar143 = *(float *)(ray + 0x48);
      fVar123 = *(float *)(ray + 0x4c);
      fVar145 = *(float *)(ray + 0x50);
      fVar125 = *(float *)(ray + 0x54);
      fVar133 = *(float *)(ray + 0x58);
      fVar135 = *(float *)(ray + 0x5c);
      fVar149 = *(float *)(ray + 0x60);
      fVar154 = *(float *)(ray + 100);
      fVar157 = *(float *)(ray + 0x68);
      fVar214 = *(float *)(ray + 0x6c);
      fVar90 = local_19d8 * fVar149 - local_18f8 * fVar145;
      fVar92 = fStack_19d4 * fVar154 - fStack_18f4 * fVar125;
      fVar93 = fStack_19d0 * fVar157 - (float)uStack_18f0 * fVar133;
      fVar104 = fStack_19cc * fVar214 - uStack_18f0._4_4_ * fVar135;
      fVar105 = local_18f8 * fVar91 - fVar134 * fVar149;
      fVar106 = fStack_18f4 * fVar112 - fVar151 * fVar154;
      fVar113 = (float)uStack_18f0 * fVar143 - fStack_1a70 * fVar157;
      fVar120 = uStack_18f0._4_4_ * fVar123 - fStack_1a6c * fVar214;
      fVar147 = fVar134 * fVar145 - local_19d8 * fVar91;
      fVar152 = fVar151 * fVar125 - fStack_19d4 * fVar112;
      fVar75 = fStack_1a70 * fVar133 - fStack_19d0 * fVar143;
      fVar88 = fStack_1a6c * fVar135 - fStack_19cc * fVar123;
      fVar91 = fVar91 * fVar130 + fVar145 * fVar121 + fVar149 * fVar131;
      fVar112 = fVar112 * fVar132 + fVar125 * fVar129 + fVar154 * fVar141;
      fVar143 = fVar143 * auVar138._8_4_ + fVar133 * auVar110._8_4_ + fVar157 * fVar186;
      fVar123 = fVar123 * auVar138._12_4_ + fVar135 * auVar110._12_4_ + fVar214 * fVar126;
      uVar182 = (uint)fVar91 & 0x80000000;
      uVar183 = (uint)fVar112 & 0x80000000;
      uVar169 = (uint)fVar143 & 0x80000000;
      uVar172 = (uint)fVar123 & 0x80000000;
      fVar145 = (float)((uint)(fVar142 * fVar90 + fVar196 * fVar105 + fVar74 * fVar147) ^ uVar182);
      fVar125 = (float)((uint)(fVar159 * fVar92 + fVar198 * fVar106 + fVar87 * fVar152) ^ uVar183);
      fVar133 = (float)((uint)(fVar165 * fVar93 + fVar200 * fVar113 + fVar89 * fVar75) ^ uVar169);
      fVar135 = (float)((uint)(fVar166 * fVar104 + fVar202 * fVar120 + fVar119 * fVar88) ^ uVar172);
      uVar175 = -(uint)(0.0 <= fVar145) & uVar60;
      uVar178 = -(uint)(0.0 <= fVar125) & uVar168;
      uVar207 = -(uint)(0.0 <= fVar133) & uVar171;
      uVar210 = -(uint)(0.0 <= fVar135) & uVar174;
      auVar16._4_4_ = uVar178;
      auVar16._0_4_ = uVar175;
      auVar16._8_4_ = uVar207;
      auVar16._12_4_ = uVar210;
      iVar216 = movmskps(iVar55,auVar16);
      auVar27._4_4_ = uVar54;
      auVar27._0_4_ = iVar216;
      auVar27._8_8_ = pIVar65;
      if (iVar216 != 0) {
        auVar139._0_4_ = fVar167 * fVar105 + fVar144 * fVar147;
        auVar139._4_4_ = fVar188 * fVar106 + fVar148 * fVar152;
        auVar139._8_4_ = fVar193 * fVar113 + fVar153 * fVar75;
        auVar139._12_4_ = fVar208 * fVar120 + fVar156 * fVar88;
        fVar144 = (float)((uint)(fVar184 * fVar90 + auVar139._0_4_) ^ uVar182);
        fVar148 = (float)((uint)(fVar189 * fVar92 + auVar139._4_4_) ^ uVar183);
        fVar153 = (float)((uint)(fVar191 * fVar93 + auVar139._8_4_) ^ uVar169);
        fVar156 = (float)((uint)(fVar194 * fVar104 + auVar139._12_4_) ^ uVar172);
        uVar175 = -(uint)(0.0 <= fVar144) & uVar175;
        uVar178 = -(uint)(0.0 <= fVar148) & uVar178;
        uVar207 = -(uint)(0.0 <= fVar153) & uVar207;
        uVar210 = -(uint)(0.0 <= fVar156) & uVar210;
        auVar12._4_4_ = uVar178;
        auVar12._0_4_ = uVar175;
        auVar12._8_4_ = uVar207;
        auVar12._12_4_ = uVar210;
        iVar216 = movmskps(iVar216,auVar12);
        auVar27._0_4_ = iVar216;
        if (iVar216 != 0) {
          fVar149 = ABS(fVar91);
          fVar154 = ABS(fVar112);
          fVar157 = ABS(fVar143);
          fVar214 = ABS(fVar123);
          auVar162._0_4_ = -(uint)(fVar144 <= fVar149 - fVar145) & uVar175;
          auVar162._4_4_ = -(uint)(fVar148 <= fVar154 - fVar125) & uVar178;
          auVar162._8_4_ = -(uint)(fVar153 <= fVar157 - fVar133) & uVar207;
          auVar162._12_4_ = -(uint)(fVar156 <= fVar214 - fVar135) & uVar210;
          iVar216 = movmskps(iVar216,auVar162);
          auVar27._0_4_ = iVar216;
          if (iVar216 != 0) {
            fVar196 = (float)(uVar182 ^
                             (uint)(fVar134 * fVar130 + local_19d8 * fVar121 + local_18f8 * fVar131)
                             );
            fVar198 = (float)(uVar183 ^
                             (uint)(fVar151 * fVar132 +
                                   fStack_19d4 * fVar129 + fStack_18f4 * fVar141));
            fVar200 = (float)(uVar169 ^
                             (uint)(fStack_1a70 * auVar138._8_4_ +
                                   fStack_19d0 * auVar110._8_4_ + (float)uStack_18f0 * fVar186));
            fVar202 = (float)(uVar172 ^
                             (uint)(fStack_1a6c * auVar138._12_4_ +
                                   fStack_19cc * auVar110._12_4_ + uStack_18f0._4_4_ * fVar126));
            uVar182 = -(uint)(fVar196 <= *(float *)(ray + 0x80) * fVar149 &&
                             *(float *)(ray + 0x30) * fVar149 < fVar196) & auVar162._0_4_;
            uVar183 = -(uint)(fVar198 <= *(float *)(ray + 0x84) * fVar154 &&
                             *(float *)(ray + 0x34) * fVar154 < fVar198) & auVar162._4_4_;
            uVar169 = -(uint)(fVar200 <= *(float *)(ray + 0x88) * fVar157 &&
                             *(float *)(ray + 0x38) * fVar157 < fVar200) & auVar162._8_4_;
            uVar172 = -(uint)(fVar202 <= *(float *)(ray + 0x8c) * fVar214 &&
                             *(float *)(ray + 0x3c) * fVar214 < fVar202) & auVar162._12_4_;
            auVar13._4_4_ = uVar183;
            auVar13._0_4_ = uVar182;
            auVar13._8_4_ = uVar169;
            auVar13._12_4_ = uVar172;
            iVar216 = movmskps(iVar216,auVar13);
            auVar27._0_4_ = iVar216;
            if (iVar216 != 0) {
              auVar118._0_4_ = -(uint)(fVar91 != 0.0) & uVar182;
              auVar118._4_4_ = -(uint)(fVar112 != 0.0) & uVar183;
              auVar118._8_4_ = -(uint)(fVar143 != 0.0) & uVar169;
              auVar118._12_4_ = -(uint)(fVar123 != 0.0) & uVar172;
              iVar216 = movmskps(iVar216,auVar118);
              auVar27._0_4_ = iVar216;
              if (iVar216 != 0) {
                pGVar4 = (context->scene->geometries).items[*(uint *)(lVar68 + 0x40 + lVar72 * 4)].
                         ptr;
                auVar231._8_8_ = pIVar65;
                auVar231._0_8_ = pGVar4;
                uVar182 = pGVar4->mask;
                auVar81._0_4_ = -(uint)((uVar182 & *(uint *)(ray + 0x90)) == 0);
                auVar81._4_4_ = -(uint)((uVar182 & *(uint *)(ray + 0x94)) == 0);
                auVar81._8_4_ = -(uint)((uVar182 & *(uint *)(ray + 0x98)) == 0);
                auVar81._12_4_ = -(uint)((uVar182 & *(uint *)(ray + 0x9c)) == 0);
                _local_1a78 = ~auVar81 & auVar118;
                iVar216 = movmskps((int)pGVar4,_local_1a78);
                auVar27._4_4_ = (int)((ulong)pGVar4 >> 0x20);
                auVar27._0_4_ = iVar216;
                if (iVar216 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar9._4_4_ = fVar154;
                    auVar9._0_4_ = fVar149;
                    auVar9._8_4_ = fVar157;
                    auVar9._12_4_ = fVar214;
                    auVar114 = rcpps(auVar139,auVar9);
                    fVar91 = auVar114._0_4_;
                    fVar112 = auVar114._4_4_;
                    fVar143 = auVar114._8_4_;
                    fVar123 = auVar114._12_4_;
                    fVar196 = (float)DAT_01f46a60;
                    fVar198 = DAT_01f46a60._4_4_;
                    fVar200 = DAT_01f46a60._8_4_;
                    fVar202 = DAT_01f46a60._12_4_;
                    fVar91 = (fVar196 - fVar149 * fVar91) * fVar91 + fVar91;
                    fVar112 = (fVar198 - fVar154 * fVar112) * fVar112 + fVar112;
                    fVar143 = (fVar200 - fVar157 * fVar143) * fVar143 + fVar143;
                    fVar123 = (fVar202 - fVar214 * fVar123) * fVar123 + fVar123;
                    auVar226._0_4_ = fVar145 * fVar91;
                    auVar226._4_4_ = fVar125 * fVar112;
                    auVar226._8_4_ = fVar133 * fVar143;
                    auVar226._12_4_ = fVar135 * fVar123;
                    auVar227 = minps(auVar226,_DAT_01f46a60);
                    auVar164._0_4_ = fVar91 * fVar144;
                    auVar164._4_4_ = fVar112 * fVar148;
                    auVar164._8_4_ = fVar143 * fVar153;
                    auVar164._12_4_ = fVar123 * fVar156;
                    auVar114 = minps(auVar164,_DAT_01f46a60);
                    auVar140._0_4_ = fVar196 - auVar227._0_4_;
                    auVar140._4_4_ = fVar198 - auVar227._4_4_;
                    auVar140._8_4_ = fVar200 - auVar227._8_4_;
                    auVar140._12_4_ = fVar202 - auVar227._12_4_;
                    auVar25._8_8_ = uVar32;
                    auVar25._0_8_ = uVar31;
                    blendvps(auVar227,auVar140,auVar25);
                    auVar10._4_4_ = fVar198 - auVar114._4_4_;
                    auVar10._0_4_ = fVar196 - auVar114._0_4_;
                    auVar10._8_4_ = fVar200 - auVar114._8_4_;
                    auVar10._12_4_ = fVar202 - auVar114._12_4_;
                    blendvps(auVar114,auVar10,auVar25);
                    uStack_18f0 = auVar138._8_8_;
                    p0.field_0._8_8_ = uStack_18f0;
                    p0.field_0._0_8_ = auVar138._0_8_;
                    uStack_1880 = auVar110._8_8_;
                    p0.field_0._24_8_ = uStack_1880;
                    p0.field_0._16_8_ = auVar110._0_8_;
                    p0.field_0._36_4_ = fVar141;
                    p0.field_0._32_4_ = fVar131;
                    p0.field_0._44_4_ = fVar126;
                    p0.field_0._40_4_ = fVar186;
                    p1.field_0._0_8_ = &itime;
                    p1.field_0._8_8_ = &t;
                    p1.field_0._16_8_ = &v_1;
                    p1.field_0._24_8_ = &u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)&p0);
                    p0.field_0._4_4_ = itime.field_0.i[1];
                    p0.field_0._0_4_ = itime.field_0.i[0];
                    p0.field_0._12_4_ = itime.field_0.i[3];
                    p0.field_0._8_4_ = itime.field_0.i[2];
                    p0.field_0.field_0.y.field_0 =
                         (vfloat_impl<4>)(vfloat_impl<4>)local_1868.field_0;
                    p0.field_0.field_0.z.field_0 =
                         (vfloat_impl<4>)(vfloat_impl<4>)local_1858.field_0;
                    auVar114 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar227 = blendvps(auVar114,(undefined1  [16])t.field_0,_local_1a78);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar227;
                    p1.field_0._0_8_ = local_19a8;
                    p1.field_0._8_8_ = pGVar4->userPtr;
                    p1.field_0._16_8_ = context->user;
                    p1.field_0._32_8_ = &p0;
                    p1.field_0._40_4_ = 4;
                    p_Var5 = pGVar4->occlusionFilterN;
                    auVar231._8_8_ = pGVar4;
                    auVar231._0_8_ = p_Var5;
                    p1.field_0._24_8_ = ray;
                    local_19a8 = _local_1a78;
                    if (p_Var5 != (RTCFilterFunctionN)0x0) {
                      auVar231 = (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                    }
                    uVar66 = auVar231._8_8_;
                    if (local_19a8 == (undefined1  [16])0x0) {
                      auVar98._8_4_ = 0xffffffff;
                      auVar98._0_8_ = 0xffffffffffffffff;
                      auVar98._12_4_ = 0xffffffff;
                      auVar98 = auVar98 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                        uVar66 = extraout_RDX;
                      }
                      auVar231._8_8_ = uVar66;
                      auVar231._0_8_ = p1.field_0._24_8_;
                      local_1a78._0_4_ = local_19a8._0_4_;
                      local_1a78._4_4_ = local_19a8._4_4_;
                      fStack_1a70 = local_19a8._8_4_;
                      fStack_1a6c = local_19a8._12_4_;
                      auVar84._0_4_ = -(uint)(local_1a78._0_4_ == 0);
                      auVar84._4_4_ = -(uint)(local_1a78._4_4_ == 0);
                      auVar84._8_4_ = -(uint)(fStack_1a70 == 0.0);
                      auVar84._12_4_ = -(uint)(fStack_1a6c == 0.0);
                      auVar98 = auVar84 ^ _DAT_01f46b70;
                      auVar227 = blendvps(_DAT_01f45a40,
                                          *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),auVar84);
                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar227;
                    }
                    auVar101._0_4_ = auVar98._0_4_ << 0x1f;
                    auVar101._4_4_ = auVar98._4_4_ << 0x1f;
                    auVar101._8_4_ = auVar98._8_4_ << 0x1f;
                    auVar101._12_4_ = auVar98._12_4_ << 0x1f;
                    local_1a78._4_4_ = auVar101._4_4_ >> 0x1f;
                    local_1a78._0_4_ = auVar101._0_4_ >> 0x1f;
                    fStack_1a70 = (float)(auVar101._8_4_ >> 0x1f);
                    fStack_1a6c = (float)(auVar101._12_4_ >> 0x1f);
                    auVar114 = blendvps(auVar114,*(undefined1 (*) [16])(ray + 0x80),auVar101);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar114;
                  }
                  uVar60 = ~local_1a78._0_4_ & uVar60;
                  uVar168 = ~local_1a78._4_4_ & uVar168;
                  uVar171 = ~(uint)fStack_1a70 & uVar171;
                  uVar174 = ~(uint)fStack_1a6c & uVar174;
                  auVar27 = auVar231;
                }
              }
            }
          }
        }
      }
      pIVar65 = auVar27._8_8_;
      iVar222 = 0x7f800000;
      iVar220 = 0x7f800000;
      iVar218 = 0x7f800000;
      iVar216 = 0x7f800000;
      auVar21._4_4_ = uVar168;
      auVar21._0_4_ = uVar60;
      auVar21._8_4_ = uVar171;
      auVar21._12_4_ = uVar174;
      iVar55 = movmskps(auVar27._0_4_,auVar21);
      uVar58 = CONCAT44(auVar27._4_4_,iVar55);
      lVar72 = lVar72 + 1;
    } while (iVar55 != 0);
    local_1908._0_4_ = local_1908._0_4_ & uVar60;
    local_1908._4_4_ = uVar177 & uVar168;
    local_1908._8_4_ = uVar180 & uVar171;
    local_1908._12_4_ = uVar181 & uVar174;
    iVar55 = movmskps((int)uVar58,local_1908);
    puVar56 = (undefined1 *)CONCAT44((int)(uVar58 >> 0x20),iVar55);
    pIVar61 = (Intersectors *)((long)&pIVar61->ptr + 1);
  } while (iVar55 != 0);
  auVar103._0_8_ = local_1908._0_8_ ^ 0xffffffffffffffff;
  auVar103._8_4_ = local_1908._8_4_ ^ 0xffffffff;
  auVar103._12_4_ = local_1908._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)((undefined1  [16])vVar51.field_0 | auVar103);
  uVar60 = movmskps((int)puVar56,(undefined1  [16])terminated.field_0);
  puVar56 = (undefined1 *)(ulong)uVar60;
  if (uVar60 == 0xf) goto LAB_006cf5fc;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006cdeae;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }